

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR yang_parse_module(lysp_yang_ctx **context,ly_in *in,lys_module *mod)

{
  ly_set *plVar1;
  LY_ERR LVar2;
  lysp_yang_ctx *plVar3;
  lysp_module *mod_00;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  ly_ctx *plVar7;
  ly_stmt kw;
  lysf_ctx local_60;
  size_t word_len;
  char *word;
  
  local_60.ext_set.field_2.dnodes = (lyd_node **)0x0;
  local_60.mod = (lys_module *)0x0;
  local_60.ext_set.size = 0;
  local_60.ext_set.count = 0;
  local_60.ctx = mod->ctx;
  plVar3 = (lysp_yang_ctx *)calloc(1,0x60);
  *context = plVar3;
  if (plVar3 != (lysp_yang_ctx *)0x0) {
    plVar3->format = LYS_IN_YANG;
    LVar2 = ly_set_new(&plVar3->parsed_mods);
    if (LVar2 == LY_SUCCESS) {
      (*context)->in = in;
      plVar3 = *context;
      plVar3->main_ctx = (lysp_ctx *)plVar3;
      mod_00 = (lysp_module *)calloc(1,0x80);
      if (mod_00 == (lysp_module *)0x0) {
        LVar2 = LY_SUCCESS;
        ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yang_parse_module");
      }
      else {
        mod_00->mod = mod;
        ly_set_add(plVar3->parsed_mods,mod_00,'\x01',(uint32_t *)0x0);
        ly_log_location((lysc_node *)0x0,(lyd_node *)0x0,(char *)0x0,in);
        LVar2 = skip_redundant_chars(*context);
        if ((LVar2 == LY_SUCCESS) &&
           (LVar2 = get_keyword(*context,&kw,&word,&word_len), LVar2 == LY_SUCCESS)) {
          if (kw == LY_STMT_MODULE) {
            LVar2 = parse_module(*context,mod_00);
            if ((LVar2 != LY_SUCCESS) ||
               (LVar2 = skip_redundant_chars(*context), LVar2 != LY_SUCCESS)) goto LAB_00179190;
            pcVar4 = in->current;
            if (*pcVar4 == '\0') {
              mod->parsed = mod_00;
              LVar2 = LY_SUCCESS;
              goto LAB_00179190;
            }
            if (*context == (lysp_yang_ctx *)0x0) {
              plVar7 = (ly_ctx *)0x0;
            }
            else {
              plVar1 = (*context)->parsed_mods;
              plVar7 = (ly_ctx *)**(undefined8 **)(plVar1->field_2).dnodes[plVar1->count - 1];
            }
            sVar5 = strlen(pcVar4);
            pcVar6 = "";
            if (0xf < sVar5) {
              pcVar6 = "...";
            }
            ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX,
                    "Trailing garbage \"%.*s%s\" after module, expected end-of-input.",0xf,pcVar4,
                    pcVar6);
          }
          else {
            if (kw == LY_STMT_SUBMODULE) {
              ly_log(mod->ctx,LY_LLERR,LY_EDENIED,
                     "Input data contains submodule which cannot be parsed directly without its main module."
                    );
              LVar2 = LY_EINVAL;
              goto LAB_00179190;
            }
            if (*context == (lysp_yang_ctx *)0x0) {
              plVar7 = (ly_ctx *)0x0;
            }
            else {
              plVar1 = (*context)->parsed_mods;
              plVar7 = (ly_ctx *)**(undefined8 **)(plVar1->field_2).dnodes[plVar1->count - 1];
            }
            pcVar4 = lyplg_ext_stmt2str(kw);
            ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX,
                    "Invalid keyword \"%s\", expected \"module\" or \"submodule\".",pcVar4);
          }
          LVar2 = LY_EVALID;
        }
      }
LAB_00179190:
      ly_log_location_revert(0,0,0,1);
      if (LVar2 == LY_SUCCESS) {
        return LY_SUCCESS;
      }
      lysp_module_free(&local_60,mod_00);
      lysp_yang_ctx_free(*context);
      *context = (lysp_yang_ctx *)0x0;
      return LVar2;
    }
    free(*context);
  }
  ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yang_parse_module");
  return LY_EMEM;
}

Assistant:

LY_ERR
yang_parse_module(struct lysp_yang_ctx **context, struct ly_in *in, struct lys_module *mod)
{
    LY_ERR ret = LY_SUCCESS;
    char *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_module *mod_p = NULL;
    struct lysf_ctx fctx = {.ctx = mod->ctx};

    /* create context */
    *context = calloc(1, sizeof **context);
    LY_CHECK_ERR_RET(!(*context), LOGMEM(mod->ctx), LY_EMEM);
    (*context)->format = LYS_IN_YANG;
    LY_CHECK_ERR_RET(ly_set_new(&(*context)->parsed_mods), free(*context); LOGMEM(mod->ctx), LY_EMEM);
    (*context)->in = in;
    (*context)->main_ctx = (struct lysp_ctx *)(*context);

    mod_p = calloc(1, sizeof *mod_p);
    LY_CHECK_ERR_GOTO(!mod_p, LOGMEM(mod->ctx), cleanup);
    mod_p->mod = mod;
    ly_set_add((*context)->parsed_mods, mod_p, 1, NULL);

    ly_log_location(NULL, NULL, NULL, in);

    /* skip redundant but valid characters at the beginning */
    ret = skip_redundant_chars(*context);
    LY_CHECK_GOTO(ret, cleanup);

    /* "module"/"submodule" */
    ret = get_keyword(*context, &kw, &word, &word_len);
    LY_CHECK_GOTO(ret, cleanup);

    if (kw == LY_STMT_SUBMODULE) {
        LOGERR(mod->ctx, LY_EDENIED, "Input data contains submodule which cannot be parsed directly without its main module.");
        ret = LY_EINVAL;
        goto cleanup;
    } else if (kw != LY_STMT_MODULE) {
        LOGVAL_PARSER((*context), LY_VCODE_MOD_SUBOMD, lyplg_ext_stmt2str(kw));
        ret = LY_EVALID;
        goto cleanup;
    }

    /* substatements */
    ret = parse_module(*context, mod_p);
    LY_CHECK_GOTO(ret, cleanup);

    /* skip redundant but valid characters at the end */
    ret = skip_redundant_chars(*context);
    LY_CHECK_GOTO(ret, cleanup);
    if (in->current[0]) {
        LOGVAL_PARSER(*context, LY_VCODE_TRAILING_MOD, 15, in->current, strlen(in->current) > 15 ? "..." : "");
        ret = LY_EVALID;
        goto cleanup;
    }

    mod->parsed = mod_p;

cleanup:
    ly_log_location_revert(0, 0, 0, 1);
    if (ret) {
        lysp_module_free(&fctx, mod_p);
        lysp_yang_ctx_free(*context);
        *context = NULL;
    }

    return ret;
}